

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::AddLanguageFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,cmBuildStep compileOrLink,
          string *lang,string *config)

{
  _Alloc_hider _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmMakefile *pcVar3;
  pointer pcVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  string *psVar10;
  cmValue cVar11;
  cmValue cVar12;
  long *plVar13;
  long *plVar14;
  byte bVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  string *opt;
  undefined8 uVar17;
  long lVar18;
  size_type *psVar19;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  msvcDebugInformationFormat;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  cmGeneratorTarget *local_208;
  string *local_200;
  string msvcRuntimeLibrary;
  size_type *local_1d8 [2];
  size_type local_1c8;
  _Alloc_hider local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  undefined1 local_1a8 [16];
  long *local_198 [2];
  long local_188 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string *local_158;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string compiler;
  string compilerSimulateId;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  msvcRuntimeLibrary.field_2._8_8_ = (lang->_M_dataplus)._M_p;
  msvcRuntimeLibrary.field_2._M_allocated_capacity = lang->_M_string_length;
  msvcRuntimeLibrary._M_dataplus._M_p = (pointer)0x6;
  msvcRuntimeLibrary._M_string_length = (long)"The CMAKE_" + 4;
  local_1d8[0] = (size_type *)0x6;
  local_1d8[1] = (size_type *)0x71908a;
  views._M_len = 3;
  views._M_array = (iterator)&msvcRuntimeLibrary;
  local_208 = target;
  cmCatViews_abi_cxx11_((string *)&msvcDebugInformationFormat,views);
  local_200 = flags;
  local_158 = config;
  AddConfigVariableFlags(this,flags,(string *)&msvcDebugInformationFormat,config);
  if (msvcDebugInformationFormat.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p !=
      (pointer)((long)&msvcDebugInformationFormat.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload + 0x10)) {
    operator_delete((void *)msvcDebugInformationFormat.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_dataplus._M_p,
                    msvcDebugInformationFormat.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._16_8_ + 1);
  }
  pcVar3 = this->Makefile;
  msvcRuntimeLibrary.field_2._8_8_ = (lang->_M_dataplus)._M_p;
  msvcRuntimeLibrary.field_2._M_allocated_capacity = lang->_M_string_length;
  msvcRuntimeLibrary._M_dataplus._M_p = (pointer)0x6;
  msvcRuntimeLibrary._M_string_length = (long)"The CMAKE_" + 4;
  local_1d8[0] = (size_type *)0xc;
  local_1d8[1] = (size_type *)0x706daa;
  views_00._M_len = 3;
  views_00._M_array = (iterator)&msvcRuntimeLibrary;
  cmCatViews_abi_cxx11_((string *)&msvcDebugInformationFormat,views_00);
  psVar10 = cmMakefile::GetSafeDefinition(pcVar3,(string *)&msvcDebugInformationFormat);
  compiler._M_dataplus._M_p = (pointer)&compiler.field_2;
  pcVar4 = (psVar10->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&compiler,pcVar4,pcVar4 + psVar10->_M_string_length);
  if (msvcDebugInformationFormat.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p !=
      (pointer)((long)&msvcDebugInformationFormat.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload + 0x10)) {
    operator_delete((void *)msvcDebugInformationFormat.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_dataplus._M_p,
                    msvcDebugInformationFormat.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._16_8_ + 1);
  }
  pcVar3 = this->Makefile;
  msvcRuntimeLibrary.field_2._8_8_ = (lang->_M_dataplus)._M_p;
  msvcRuntimeLibrary.field_2._M_allocated_capacity = lang->_M_string_length;
  msvcRuntimeLibrary._M_dataplus._M_p = (pointer)0x6;
  msvcRuntimeLibrary._M_string_length = (long)"The CMAKE_" + 4;
  local_1d8[0] = (size_type *)0xc;
  local_1d8[1] = (size_type *)0x6dc19f;
  views_01._M_len = 3;
  views_01._M_array = (iterator)&msvcRuntimeLibrary;
  cmCatViews_abi_cxx11_((string *)&msvcDebugInformationFormat,views_01);
  psVar10 = cmMakefile::GetSafeDefinition(pcVar3,(string *)&msvcDebugInformationFormat);
  compilerSimulateId._M_dataplus._M_p = (pointer)&compilerSimulateId.field_2;
  pcVar4 = (psVar10->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&compilerSimulateId,pcVar4,pcVar4 + psVar10->_M_string_length);
  if (msvcDebugInformationFormat.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p !=
      (pointer)((long)&msvcDebugInformationFormat.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload + 0x10)) {
    operator_delete((void *)msvcDebugInformationFormat.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_dataplus._M_p,
                    msvcDebugInformationFormat.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._16_8_ + 1);
  }
  iVar8 = std::__cxx11::string::compare((char *)lang);
  if (iVar8 == 0) {
    paVar16 = &msvcRuntimeLibrary.field_2;
    msvcRuntimeLibrary._M_dataplus._M_p = (pointer)paVar16;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&msvcRuntimeLibrary,"Swift_LANGUAGE_VERSION","");
    cVar11 = cmGeneratorTarget::GetProperty(local_208,&msvcRuntimeLibrary);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msvcRuntimeLibrary._M_dataplus._M_p != paVar16) {
      operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                      msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
    }
    if (cVar11.Value != (string *)0x0) {
      pcVar3 = this->Makefile;
      msvcRuntimeLibrary._M_dataplus._M_p = (pointer)paVar16;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&msvcRuntimeLibrary,"CMAKE_Swift_COMPILER_VERSION","");
      psVar10 = (string *)cmMakefile::GetDefinition(pcVar3,&msvcRuntimeLibrary);
      if (psVar10 == (string *)0x0) {
        psVar10 = &cmValue::Empty_abi_cxx11_;
      }
      bVar6 = cmSystemTools::VersionCompare(OP_GREATER_EQUAL,psVar10,"4.2");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msvcRuntimeLibrary._M_dataplus._M_p != paVar16) {
        operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                        msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        std::operator+(&msvcRuntimeLibrary,"-swift-version ",cVar11.Value);
        (*this->_vptr_cmLocalGenerator[6])(this,local_200,&msvcRuntimeLibrary);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msvcRuntimeLibrary._M_dataplus._M_p != paVar16) {
LAB_00206a48:
          operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                          msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  else {
    iVar8 = std::__cxx11::string::compare((char *)lang);
    if (iVar8 == 0) {
      cmGeneratorTarget::AddCUDAArchitectureFlags(local_208,compileOrLink,local_158,local_200);
      cmGeneratorTarget::AddCUDAToolkitFlags(local_208,local_200);
    }
    else {
      iVar8 = std::__cxx11::string::compare((char *)lang);
      if (iVar8 == 0) {
        cmGeneratorTarget::AddISPCTargetFlags(local_208,local_200);
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)lang);
        if (iVar8 == 0) {
          pcVar3 = this->Makefile;
          paVar16 = &msvcRuntimeLibrary.field_2;
          msvcRuntimeLibrary._M_dataplus._M_p = (pointer)paVar16;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&msvcRuntimeLibrary,"CMAKE_RC_COMPILER","");
          psVar10 = cmMakefile::GetSafeDefinition(pcVar3,&msvcRuntimeLibrary);
          lVar18 = std::__cxx11::string::find((char *)psVar10,0x6dc17c,0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msvcRuntimeLibrary._M_dataplus._M_p != paVar16) {
            operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                            msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
          }
          if (lVar18 != -1) {
            pcVar3 = this->Makefile;
            msvcRuntimeLibrary._M_dataplus._M_p = (pointer)paVar16;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&msvcRuntimeLibrary,"CMAKE_C_COMPILER_ID","");
            cmMakefile::GetSafeDefinition(pcVar3,&msvcRuntimeLibrary);
            std::__cxx11::string::_M_assign((string *)&compiler);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msvcRuntimeLibrary._M_dataplus._M_p != paVar16) {
              operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                              msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
            }
            pcVar3 = this->Makefile;
            if (compiler._M_string_length == 0) {
              msvcRuntimeLibrary._M_dataplus._M_p = (pointer)paVar16;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&msvcRuntimeLibrary,"CMAKE_CXX_COMPILER_ID","");
              cmMakefile::GetSafeDefinition(pcVar3,&msvcRuntimeLibrary);
              std::__cxx11::string::_M_assign((string *)&compiler);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msvcRuntimeLibrary._M_dataplus._M_p != paVar16) {
                operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                                msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
              }
              pcVar3 = this->Makefile;
              msvcRuntimeLibrary._M_dataplus._M_p = (pointer)paVar16;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&msvcRuntimeLibrary,"CMAKE_CXX_SIMULATE_ID","");
              cmMakefile::GetSafeDefinition(pcVar3,&msvcRuntimeLibrary);
              std::__cxx11::string::_M_assign((string *)&compilerSimulateId);
            }
            else {
              msvcRuntimeLibrary._M_dataplus._M_p = (pointer)paVar16;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&msvcRuntimeLibrary,"CMAKE_C_SIMULATE_ID","");
              cmMakefile::GetSafeDefinition(pcVar3,&msvcRuntimeLibrary);
              std::__cxx11::string::_M_assign((string *)&compilerSimulateId);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msvcRuntimeLibrary._M_dataplus._M_p != paVar16) goto LAB_00206a48;
            goto LAB_00206a55;
          }
        }
        iVar8 = std::__cxx11::string::compare((char *)lang);
        if (iVar8 == 0) {
          cmGeneratorTarget::AddHIPArchitectureFlags(local_208,local_200);
        }
      }
    }
  }
LAB_00206a55:
  iVar8 = std::__cxx11::string::compare((char *)&compiler);
  if (iVar8 == 0) {
    pcVar3 = this->Makefile;
    paVar16 = &msvcRuntimeLibrary.field_2;
    msvcRuntimeLibrary._M_dataplus._M_p = (pointer)paVar16;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&msvcRuntimeLibrary,"CMAKE_CLANG_VFS_OVERLAY","");
    cVar11 = cmMakefile::GetDefinition(pcVar3,&msvcRuntimeLibrary);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msvcRuntimeLibrary._M_dataplus._M_p != paVar16) {
      operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                      msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
    }
    if (cVar11.Value != (string *)0x0) {
      iVar8 = std::__cxx11::string::compare((char *)&compilerSimulateId);
      if (iVar8 == 0) {
        msvcRuntimeLibrary._M_dataplus._M_p = (pointer)paVar16;
        std::__cxx11::string::_M_construct<char_const*>((string *)&msvcRuntimeLibrary,"-Xclang","");
        local_1d8[0] = &local_1c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"-ivfsoverlay","");
        local_1b8 = local_1a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"-Xclang","");
        plVar13 = local_188;
        pcVar4 = ((cVar11.Value)->_M_dataplus)._M_p;
        local_198[0] = plVar13;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_198,pcVar4,pcVar4 + (cVar11.Value)->_M_string_length);
        __l_00._M_len = 4;
        __l_00._M_array = &msvcRuntimeLibrary;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&msvcDebugInformationFormat,__l_00,(allocator_type *)&local_228);
        uVar5 = msvcDebugInformationFormat.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload._M_value._M_string_length;
        for (uVar17 = msvcDebugInformationFormat.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._M_value._M_dataplus._M_p; uVar17 != uVar5; uVar17 = uVar17 + 0x20
            ) {
          (*this->_vptr_cmLocalGenerator[8])(this,local_200,uVar17);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&msvcDebugInformationFormat);
        lVar18 = -0x80;
        do {
          if (plVar13 != (long *)plVar13[-2]) {
            operator_delete((long *)plVar13[-2],*plVar13 + 1);
          }
          plVar13 = plVar13 + -4;
          lVar18 = lVar18 + 0x20;
        } while (lVar18 != 0);
      }
      else {
        msvcRuntimeLibrary._M_dataplus._M_p = (pointer)paVar16;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&msvcRuntimeLibrary,"-ivfsoverlay","");
        psVar19 = &local_1c8;
        pcVar4 = ((cVar11.Value)->_M_dataplus)._M_p;
        local_1d8[0] = psVar19;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1d8,pcVar4,pcVar4 + (cVar11.Value)->_M_string_length);
        __l._M_len = 2;
        __l._M_array = &msvcRuntimeLibrary;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&msvcDebugInformationFormat,__l,(allocator_type *)&local_228);
        uVar5 = msvcDebugInformationFormat.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload._M_value._M_string_length;
        for (uVar17 = msvcDebugInformationFormat.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._M_value._M_dataplus._M_p; uVar17 != uVar5; uVar17 = uVar17 + 0x20
            ) {
          (*this->_vptr_cmLocalGenerator[8])(this,local_200,uVar17);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&msvcDebugInformationFormat);
        lVar18 = -0x40;
        do {
          if (psVar19 != (size_type *)psVar19[-2]) {
            operator_delete((size_type *)psVar19[-2],*psVar19 + 1);
          }
          psVar19 = psVar19 + -4;
          lVar18 = lVar18 + 0x20;
        } while (lVar18 != 0);
      }
    }
  }
  pcVar3 = this->Makefile;
  paVar16 = &msvcRuntimeLibrary.field_2;
  msvcRuntimeLibrary._M_dataplus._M_p = (pointer)paVar16;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&msvcRuntimeLibrary,"CMAKE_MSVC_RUNTIME_LIBRARY_DEFAULT","");
  cVar11 = cmMakefile::GetDefinition(pcVar3,&msvcRuntimeLibrary);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)msvcRuntimeLibrary._M_dataplus._M_p != paVar16) {
    operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                    msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
  }
  if ((cVar11.Value != (string *)0x0) && ((cVar11.Value)->_M_string_length != 0)) {
    msvcRuntimeLibrary._M_dataplus._M_p = (pointer)paVar16;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&msvcRuntimeLibrary,"MSVC_RUNTIME_LIBRARY","");
    cVar12 = cmGeneratorTarget::GetProperty(local_208,&msvcRuntimeLibrary);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msvcRuntimeLibrary._M_dataplus._M_p != paVar16) {
      operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                      msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
    }
    if (cVar12.Value != (string *)0x0) {
      cVar11 = cVar12;
    }
    pcVar4 = ((cVar11.Value)->_M_dataplus)._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar4,pcVar4 + (cVar11.Value)->_M_string_length);
    _Var1._M_p = (pointer)((long)&msvcDebugInformationFormat.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload + 0x10);
    msvcDebugInformationFormat.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length = 0;
    msvcDebugInformationFormat.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._16_8_ =
         msvcDebugInformationFormat.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._16_8_ & 0xffffffffffffff00;
    msvcDebugInformationFormat.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)_Var1._M_p;
    cmGeneratorExpression::Evaluate
              (&msvcRuntimeLibrary,&local_90,this,local_158,local_208,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,
               (string *)&msvcDebugInformationFormat);
    if (msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p != (_Alloc_hider)_Var1._M_p) {
      operator_delete((void *)msvcDebugInformationFormat.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._M_value._M_dataplus._M_p,
                      msvcDebugInformationFormat.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (msvcRuntimeLibrary._M_string_length != 0) {
      pcVar3 = this->Makefile;
      std::operator+(&local_130,"CMAKE_",lang);
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_130);
      paVar16 = &local_228.field_2;
      psVar19 = (size_type *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar19) {
        local_228.field_2._M_allocated_capacity = *psVar19;
        local_228.field_2._8_8_ = plVar13[3];
        local_228._M_dataplus._M_p = (pointer)paVar16;
      }
      else {
        local_228.field_2._M_allocated_capacity = *psVar19;
        local_228._M_dataplus._M_p = (pointer)*plVar13;
      }
      local_228._M_string_length = plVar13[1];
      *plVar13 = (long)psVar19;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_228,(ulong)msvcRuntimeLibrary._M_dataplus._M_p);
      msvcDebugInformationFormat.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p =
           (_Alloc_hider)
           ((long)&msvcDebugInformationFormat.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload + 0x10);
      plVar14 = plVar13 + 2;
      if ((long *)*plVar13 == plVar14) {
        msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._16_8_ = *plVar14;
        msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._24_8_ = plVar13[3];
      }
      else {
        msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._16_8_ = *plVar14;
        msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)*plVar13;
      }
      msvcDebugInformationFormat.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_string_length = plVar13[1];
      *plVar13 = (long)plVar14;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      cVar11 = cmMakefile::GetDefinition(pcVar3,(string *)&msvcDebugInformationFormat);
      if (msvcDebugInformationFormat.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p !=
          (pointer)((long)&msvcDebugInformationFormat.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload + 0x10)) {
        operator_delete((void *)msvcDebugInformationFormat.
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload._M_value._M_dataplus._M_p,
                        msvcDebugInformationFormat.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != paVar16) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      paVar2 = &local_130.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      if (cVar11.Value == (string *)0x0) {
        pcVar3 = this->Makefile;
        std::operator+(&local_228,"CMAKE_",lang);
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_228);
        msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p =
             (_Alloc_hider)
             ((long)&msvcDebugInformationFormat.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x10);
        plVar14 = plVar13 + 2;
        if ((long *)*plVar13 == plVar14) {
          msvcDebugInformationFormat.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._16_8_ = *plVar14;
          msvcDebugInformationFormat.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._24_8_ = plVar13[3];
        }
        else {
          msvcDebugInformationFormat.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._16_8_ = *plVar14;
          msvcDebugInformationFormat.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)*plVar13;
        }
        msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_string_length = plVar13[1];
        *plVar13 = (long)plVar14;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        psVar10 = cmMakefile::GetSafeDefinition(pcVar3,(string *)&msvcDebugInformationFormat);
        iVar8 = std::__cxx11::string::compare((char *)psVar10);
        if (iVar8 == 0) {
LAB_00207095:
          bVar6 = true;
          if ((cmSystemTools::s_ErrorOccurred == false) &&
             (cmSystemTools::s_FatalErrorOccurred == false)) {
            bVar6 = cmSystemTools::GetInterruptFlag();
          }
          bVar15 = bVar6 ^ 1;
          if (iVar8 != 0) goto LAB_002070c5;
        }
        else {
          pcVar3 = this->Makefile;
          std::operator+(&local_50,"CMAKE_",lang);
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_50);
          psVar19 = (size_type *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar19) {
            local_130.field_2._M_allocated_capacity = *psVar19;
            local_130.field_2._8_8_ = plVar13[3];
            local_130._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_130.field_2._M_allocated_capacity = *psVar19;
            local_130._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_130._M_string_length = plVar13[1];
          *plVar13 = (long)psVar19;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          psVar10 = cmMakefile::GetSafeDefinition(pcVar3,&local_130);
          iVar9 = std::__cxx11::string::compare((char *)psVar10);
          if (iVar9 == 0) goto LAB_00207095;
          bVar15 = 0;
LAB_002070c5:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != paVar2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        if (msvcDebugInformationFormat.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p !=
            (pointer)((long)&msvcDebugInformationFormat.
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_payload + 0x10)) {
          operator_delete((void *)msvcDebugInformationFormat.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload._M_value._M_dataplus._M_p,
                          msvcDebugInformationFormat.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar16) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        if (bVar15 != 0) {
          std::operator+(&local_110,"MSVC_RUNTIME_LIBRARY value \'",&msvcRuntimeLibrary);
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_110);
          psVar19 = (size_type *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar19) {
            local_178.field_2._M_allocated_capacity = *psVar19;
            local_178.field_2._8_8_ = plVar13[3];
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          }
          else {
            local_178.field_2._M_allocated_capacity = *psVar19;
            local_178._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_178._M_string_length = plVar13[1];
          *plVar13 = (long)psVar19;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_178,(ulong)(lang->_M_dataplus)._M_p);
          psVar19 = (size_type *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar19) {
            local_228.field_2._M_allocated_capacity = *psVar19;
            local_228.field_2._8_8_ = plVar13[3];
            local_228._M_dataplus._M_p = (pointer)paVar16;
          }
          else {
            local_228.field_2._M_allocated_capacity = *psVar19;
            local_228._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_228._M_string_length = plVar13[1];
          *plVar13 = (long)psVar19;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_228);
          msvcDebugInformationFormat.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p =
               (_Alloc_hider)
               ((long)&msvcDebugInformationFormat.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload + 0x10);
          plVar14 = plVar13 + 2;
          if ((long *)*plVar13 == plVar14) {
            msvcDebugInformationFormat.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._16_8_ = *plVar14;
            msvcDebugInformationFormat.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._24_8_ = plVar13[3];
          }
          else {
            msvcDebugInformationFormat.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._16_8_ = *plVar14;
            msvcDebugInformationFormat.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)*plVar13;
          }
          msvcDebugInformationFormat.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_string_length = plVar13[1];
          *plVar13 = (long)plVar14;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,
                              (string *)&msvcDebugInformationFormat,&this->DirectoryBacktrace);
          if (msvcDebugInformationFormat.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_dataplus._M_p !=
              (pointer)((long)&msvcDebugInformationFormat.
                               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ._M_payload + 0x10)) {
            operator_delete((void *)msvcDebugInformationFormat.
                                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ._M_payload._M_value._M_dataplus._M_p,
                            msvcDebugInformationFormat.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != paVar16) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else {
        AppendCompileOptions(this,local_200,cVar11.Value,(char *)0x0);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msvcRuntimeLibrary._M_dataplus._M_p != &msvcRuntimeLibrary.field_2) {
      operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                      msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
    }
  }
  paVar16 = &msvcRuntimeLibrary.field_2;
  pcVar3 = this->Makefile;
  msvcRuntimeLibrary._M_dataplus._M_p = (pointer)paVar16;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&msvcRuntimeLibrary,"CMAKE_WATCOM_RUNTIME_LIBRARY_DEFAULT","");
  cVar11 = cmMakefile::GetDefinition(pcVar3,&msvcRuntimeLibrary);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)msvcRuntimeLibrary._M_dataplus._M_p != paVar16) {
    operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                    msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
  }
  if ((cVar11.Value != (string *)0x0) && ((cVar11.Value)->_M_string_length != 0)) {
    msvcRuntimeLibrary._M_dataplus._M_p = (pointer)paVar16;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&msvcRuntimeLibrary,"WATCOM_RUNTIME_LIBRARY","");
    cVar12 = cmGeneratorTarget::GetProperty(local_208,&msvcRuntimeLibrary);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msvcRuntimeLibrary._M_dataplus._M_p != paVar16) {
      operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                      msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
    }
    if (cVar12.Value != (string *)0x0) {
      cVar11 = cVar12;
    }
    pcVar4 = ((cVar11.Value)->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar4,pcVar4 + (cVar11.Value)->_M_string_length);
    _Var1._M_p = (pointer)((long)&msvcDebugInformationFormat.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload + 0x10);
    msvcDebugInformationFormat.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length = 0;
    msvcDebugInformationFormat.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._16_8_ =
         msvcDebugInformationFormat.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._16_8_ & 0xffffffffffffff00;
    msvcDebugInformationFormat.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)_Var1._M_p;
    cmGeneratorExpression::Evaluate
              (&msvcRuntimeLibrary,&local_b0,this,local_158,local_208,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,
               (string *)&msvcDebugInformationFormat);
    if (msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p != (_Alloc_hider)_Var1._M_p) {
      operator_delete((void *)msvcDebugInformationFormat.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._M_value._M_dataplus._M_p,
                      msvcDebugInformationFormat.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (msvcRuntimeLibrary._M_string_length != 0) {
      pcVar3 = this->Makefile;
      std::operator+(&local_178,"CMAKE_",lang);
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_178);
      paVar16 = &local_228.field_2;
      psVar19 = (size_type *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar19) {
        local_228.field_2._M_allocated_capacity = *psVar19;
        local_228.field_2._8_8_ = plVar13[3];
        local_228._M_dataplus._M_p = (pointer)paVar16;
      }
      else {
        local_228.field_2._M_allocated_capacity = *psVar19;
        local_228._M_dataplus._M_p = (pointer)*plVar13;
      }
      local_228._M_string_length = plVar13[1];
      *plVar13 = (long)psVar19;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_228,(ulong)msvcRuntimeLibrary._M_dataplus._M_p);
      msvcDebugInformationFormat.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p =
           (_Alloc_hider)
           ((long)&msvcDebugInformationFormat.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload + 0x10);
      plVar14 = plVar13 + 2;
      if ((long *)*plVar13 == plVar14) {
        msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._16_8_ = *plVar14;
        msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._24_8_ = plVar13[3];
      }
      else {
        msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._16_8_ = *plVar14;
        msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)*plVar13;
      }
      msvcDebugInformationFormat.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_string_length = plVar13[1];
      *plVar13 = (long)plVar14;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      cVar11 = cmMakefile::GetDefinition(pcVar3,(string *)&msvcDebugInformationFormat);
      if (msvcDebugInformationFormat.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p !=
          (pointer)((long)&msvcDebugInformationFormat.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload + 0x10)) {
        operator_delete((void *)msvcDebugInformationFormat.
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload._M_value._M_dataplus._M_p,
                        msvcDebugInformationFormat.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != paVar16) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      paVar2 = &local_178.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != paVar2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      if (cVar11.Value == (string *)0x0) {
        pcVar3 = this->Makefile;
        std::operator+(&local_228,"CMAKE_",lang);
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_228);
        msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p =
             (_Alloc_hider)
             ((long)&msvcDebugInformationFormat.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x10);
        plVar14 = plVar13 + 2;
        if ((long *)*plVar13 == plVar14) {
          msvcDebugInformationFormat.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._16_8_ = *plVar14;
          msvcDebugInformationFormat.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._24_8_ = plVar13[3];
        }
        else {
          msvcDebugInformationFormat.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._16_8_ = *plVar14;
          msvcDebugInformationFormat.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)*plVar13;
        }
        msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_string_length = plVar13[1];
        *plVar13 = (long)plVar14;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        psVar10 = cmMakefile::GetSafeDefinition(pcVar3,(string *)&msvcDebugInformationFormat);
        iVar8 = std::__cxx11::string::compare((char *)psVar10);
        if (iVar8 == 0) {
LAB_002076ef:
          bVar6 = true;
          if ((cmSystemTools::s_ErrorOccurred == false) &&
             (cmSystemTools::s_FatalErrorOccurred == false)) {
            bVar6 = cmSystemTools::GetInterruptFlag();
          }
          bVar15 = bVar6 ^ 1;
          if (iVar8 != 0) goto LAB_0020771f;
        }
        else {
          pcVar3 = this->Makefile;
          std::operator+(&local_110,"CMAKE_",lang);
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_110);
          psVar19 = (size_type *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar19) {
            local_178.field_2._M_allocated_capacity = *psVar19;
            local_178.field_2._8_8_ = plVar13[3];
            local_178._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_178.field_2._M_allocated_capacity = *psVar19;
            local_178._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_178._M_string_length = plVar13[1];
          *plVar13 = (long)psVar19;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          psVar10 = cmMakefile::GetSafeDefinition(pcVar3,&local_178);
          iVar9 = std::__cxx11::string::compare((char *)psVar10);
          if (iVar9 == 0) goto LAB_002076ef;
          bVar15 = 0;
LAB_0020771f:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != paVar2) {
            operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
        }
        if (msvcDebugInformationFormat.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p !=
            (pointer)((long)&msvcDebugInformationFormat.
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_payload + 0x10)) {
          operator_delete((void *)msvcDebugInformationFormat.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload._M_value._M_dataplus._M_p,
                          msvcDebugInformationFormat.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar16) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        if (bVar15 != 0) {
          std::operator+(&local_70,"WATCOM_RUNTIME_LIBRARY value \'",&msvcRuntimeLibrary);
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_70);
          psVar19 = (size_type *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar19) {
            local_150.field_2._M_allocated_capacity = *psVar19;
            local_150.field_2._8_8_ = plVar13[3];
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          }
          else {
            local_150.field_2._M_allocated_capacity = *psVar19;
            local_150._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_150._M_string_length = plVar13[1];
          *plVar13 = (long)psVar19;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_150,(ulong)(lang->_M_dataplus)._M_p);
          psVar19 = (size_type *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar19) {
            local_228.field_2._M_allocated_capacity = *psVar19;
            local_228.field_2._8_8_ = plVar13[3];
            local_228._M_dataplus._M_p = (pointer)paVar16;
          }
          else {
            local_228.field_2._M_allocated_capacity = *psVar19;
            local_228._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_228._M_string_length = plVar13[1];
          *plVar13 = (long)psVar19;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_228);
          msvcDebugInformationFormat.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p =
               (_Alloc_hider)
               ((long)&msvcDebugInformationFormat.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload + 0x10);
          plVar14 = plVar13 + 2;
          if ((long *)*plVar13 == plVar14) {
            msvcDebugInformationFormat.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._16_8_ = *plVar14;
            msvcDebugInformationFormat.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._24_8_ = plVar13[3];
          }
          else {
            msvcDebugInformationFormat.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._16_8_ = *plVar14;
            msvcDebugInformationFormat.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)*plVar13;
          }
          msvcDebugInformationFormat.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_string_length = plVar13[1];
          *plVar13 = (long)plVar14;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,
                              (string *)&msvcDebugInformationFormat,&this->DirectoryBacktrace);
          if (msvcDebugInformationFormat.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_dataplus._M_p !=
              (pointer)((long)&msvcDebugInformationFormat.
                               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ._M_payload + 0x10)) {
            operator_delete((void *)msvcDebugInformationFormat.
                                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ._M_payload._M_value._M_dataplus._M_p,
                            msvcDebugInformationFormat.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != paVar16) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else {
        AppendCompileOptions(this,local_200,cVar11.Value,(char *)0x0);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msvcRuntimeLibrary._M_dataplus._M_p != &msvcRuntimeLibrary.field_2) {
      operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                      msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
    }
  }
  GetMSVCDebugFormatName(&msvcDebugInformationFormat,this,local_158,local_208);
  if ((msvcDebugInformationFormat.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_engaged != true) ||
     (msvcDebugInformationFormat.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_string_length == 0)) goto LAB_00207c37;
  pcVar3 = this->Makefile;
  msvcRuntimeLibrary.field_2._8_8_ = (lang->_M_dataplus)._M_p;
  msvcRuntimeLibrary.field_2._M_allocated_capacity = lang->_M_string_length;
  msvcRuntimeLibrary._M_dataplus._M_p = (pointer)0x6;
  msvcRuntimeLibrary._M_string_length = (long)"The CMAKE_" + 4;
  local_1d8[0] = (size_type *)0x2f;
  local_1d8[1] = (size_type *)0x6dc2ff;
  local_1c8 = msvcDebugInformationFormat.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_string_length;
  local_1c0._M_p =
       (pointer)msvcDebugInformationFormat.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload._M_value._M_dataplus._M_p;
  views_02._M_len = 4;
  views_02._M_array = (iterator)&msvcRuntimeLibrary;
  cmCatViews_abi_cxx11_(&local_228,views_02);
  cVar11 = cmMakefile::GetDefinition(pcVar3,&local_228);
  paVar16 = &local_228.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar16) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if (cVar11.Value != (string *)0x0) {
    AppendCompileOptions(this,local_200,cVar11.Value,(char *)0x0);
    goto LAB_00207c37;
  }
  pcVar3 = this->Makefile;
  msvcRuntimeLibrary.field_2._8_8_ = (lang->_M_dataplus)._M_p;
  msvcRuntimeLibrary.field_2._M_allocated_capacity = lang->_M_string_length;
  msvcRuntimeLibrary._M_dataplus._M_p = (pointer)0x6;
  msvcRuntimeLibrary._M_string_length = (long)"The CMAKE_" + 4;
  local_1d8[0] = (size_type *)0xc;
  local_1d8[1] = (size_type *)0x706daa;
  views_03._M_len = 3;
  views_03._M_array = (iterator)&msvcRuntimeLibrary;
  cmCatViews_abi_cxx11_(&local_228,views_03);
  psVar10 = cmMakefile::GetSafeDefinition(pcVar3,&local_228);
  if ((psVar10->_M_string_length == 4) && (*(int *)(psVar10->_M_dataplus)._M_p == 0x4356534d)) {
    bVar6 = false;
LAB_00207b26:
    bVar7 = true;
    if ((cmSystemTools::s_ErrorOccurred == false) && (cmSystemTools::s_FatalErrorOccurred == false))
    {
      bVar7 = cmSystemTools::GetInterruptFlag();
    }
    bVar15 = bVar7 ^ 1;
    if (bVar6) goto LAB_00207b51;
  }
  else {
    pcVar3 = this->Makefile;
    msvcRuntimeLibrary.field_2._8_8_ = (lang->_M_dataplus)._M_p;
    msvcRuntimeLibrary.field_2._M_allocated_capacity = lang->_M_string_length;
    msvcRuntimeLibrary._M_dataplus._M_p = (pointer)0x6;
    msvcRuntimeLibrary._M_string_length = (long)"The CMAKE_" + 4;
    local_1d8[0] = (size_type *)0xc;
    local_1d8[1] = (size_type *)0x6dc19f;
    views_04._M_len = 3;
    views_04._M_array = (iterator)&msvcRuntimeLibrary;
    cmCatViews_abi_cxx11_(&local_150,views_04);
    psVar10 = cmMakefile::GetSafeDefinition(pcVar3,&local_150);
    if ((psVar10->_M_string_length == 4) && (*(int *)(psVar10->_M_dataplus)._M_p == 0x4356534d)) {
      bVar6 = true;
      goto LAB_00207b26;
    }
    bVar15 = 0;
LAB_00207b51:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar16) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if (bVar15 != 0) {
    msvcRuntimeLibrary._M_dataplus._M_p = (pointer)0x25;
    msvcRuntimeLibrary._M_string_length = (size_type)anon_var_dwarf_55ef40;
    msvcRuntimeLibrary.field_2._M_allocated_capacity =
         msvcDebugInformationFormat.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_string_length;
    msvcRuntimeLibrary.field_2._8_8_ =
         msvcDebugInformationFormat.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_dataplus._M_p;
    local_1d8[0] = (size_type *)0x15;
    local_1d8[1] = (size_type *)0x6dc271;
    local_1c0._M_p = (lang->_M_dataplus)._M_p;
    local_1c8 = lang->_M_string_length;
    local_1b8 = (undefined1 *)0xa;
    local_1b0 = " compiler.";
    views_05._M_len = 5;
    views_05._M_array = (iterator)&msvcRuntimeLibrary;
    cmCatViews_abi_cxx11_(&local_228,views_05);
    cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,&local_228,
                        &this->DirectoryBacktrace);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar16) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
  }
LAB_00207c37:
  if ((msvcDebugInformationFormat.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_engaged == true) &&
     (msvcDebugInformationFormat.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false,
     msvcDebugInformationFormat.
     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
     ._M_payload.
     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
     .
     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ._M_payload._M_value._M_dataplus._M_p !=
     (pointer)((long)&msvcDebugInformationFormat.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload + 0x10))) {
    operator_delete((void *)msvcDebugInformationFormat.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_dataplus._M_p,
                    msvcDebugInformationFormat.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)compilerSimulateId._M_dataplus._M_p != &compilerSimulateId.field_2) {
    operator_delete(compilerSimulateId._M_dataplus._M_p,
                    compilerSimulateId.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)compiler._M_dataplus._M_p != &compiler.field_2) {
    operator_delete(compiler._M_dataplus._M_p,compiler.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::AddLanguageFlags(std::string& flags,
                                        cmGeneratorTarget const* target,
                                        cmBuildStep compileOrLink,
                                        const std::string& lang,
                                        const std::string& config)
{
  // Add language-specific flags.
  this->AddConfigVariableFlags(flags, cmStrCat("CMAKE_", lang, "_FLAGS"),
                               config);

  std::string compiler = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_COMPILER_ID"));

  std::string compilerSimulateId = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_SIMULATE_ID"));

  if (lang == "Swift") {
    if (cmValue v = target->GetProperty("Swift_LANGUAGE_VERSION")) {
      if (cmSystemTools::VersionCompare(
            cmSystemTools::OP_GREATER_EQUAL,
            this->Makefile->GetDefinition("CMAKE_Swift_COMPILER_VERSION"),
            "4.2")) {
        this->AppendFlags(flags, "-swift-version " + *v);
      }
    }
  } else if (lang == "CUDA") {
    target->AddCUDAArchitectureFlags(compileOrLink, config, flags);
    target->AddCUDAToolkitFlags(flags);
  } else if (lang == "ISPC") {
    target->AddISPCTargetFlags(flags);
  } else if (lang == "RC" &&
             this->Makefile->GetSafeDefinition("CMAKE_RC_COMPILER")
                 .find("llvm-rc") != std::string::npos) {
    compiler = this->Makefile->GetSafeDefinition("CMAKE_C_COMPILER_ID");
    if (!compiler.empty()) {
      compilerSimulateId =
        this->Makefile->GetSafeDefinition("CMAKE_C_SIMULATE_ID");
    } else {
      compiler = this->Makefile->GetSafeDefinition("CMAKE_CXX_COMPILER_ID");
      compilerSimulateId =
        this->Makefile->GetSafeDefinition("CMAKE_CXX_SIMULATE_ID");
    }
  } else if (lang == "HIP") {
    target->AddHIPArchitectureFlags(flags);
  }

  // Add VFS Overlay for Clang compilers
  if (compiler == "Clang") {
    if (cmValue vfsOverlay =
          this->Makefile->GetDefinition("CMAKE_CLANG_VFS_OVERLAY")) {
      if (compilerSimulateId == "MSVC") {
        this->AppendCompileOptions(
          flags,
          std::vector<std::string>{ "-Xclang", "-ivfsoverlay", "-Xclang",
                                    *vfsOverlay });
      } else {
        this->AppendCompileOptions(
          flags, std::vector<std::string>{ "-ivfsoverlay", *vfsOverlay });
      }
    }
  }
  // Add MSVC runtime library flags.  This is activated by the presence
  // of a default selection whether or not it is overridden by a property.
  cmValue msvcRuntimeLibraryDefault =
    this->Makefile->GetDefinition("CMAKE_MSVC_RUNTIME_LIBRARY_DEFAULT");
  if (cmNonempty(msvcRuntimeLibraryDefault)) {
    cmValue msvcRuntimeLibraryValue =
      target->GetProperty("MSVC_RUNTIME_LIBRARY");
    if (!msvcRuntimeLibraryValue) {
      msvcRuntimeLibraryValue = msvcRuntimeLibraryDefault;
    }
    std::string const msvcRuntimeLibrary = cmGeneratorExpression::Evaluate(
      *msvcRuntimeLibraryValue, this, config, target);
    if (!msvcRuntimeLibrary.empty()) {
      if (cmValue msvcRuntimeLibraryOptions = this->Makefile->GetDefinition(
            "CMAKE_" + lang + "_COMPILE_OPTIONS_MSVC_RUNTIME_LIBRARY_" +
            msvcRuntimeLibrary)) {
        this->AppendCompileOptions(flags, *msvcRuntimeLibraryOptions);
      } else if ((this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_COMPILER_ID") == "MSVC" ||
                  this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_SIMULATE_ID") == "MSVC") &&
                 !cmSystemTools::GetErrorOccurredFlag()) {
        // The compiler uses the MSVC ABI so it needs a known runtime library.
        this->IssueMessage(MessageType::FATAL_ERROR,
                           "MSVC_RUNTIME_LIBRARY value '" +
                             msvcRuntimeLibrary + "' not known for this " +
                             lang + " compiler.");
      }
    }
  }

  // Add Watcom runtime library flags.  This is activated by the presence
  // of a default selection whether or not it is overridden by a property.
  cmValue watcomRuntimeLibraryDefault =
    this->Makefile->GetDefinition("CMAKE_WATCOM_RUNTIME_LIBRARY_DEFAULT");
  if (cmNonempty(watcomRuntimeLibraryDefault)) {
    cmValue watcomRuntimeLibraryValue =
      target->GetProperty("WATCOM_RUNTIME_LIBRARY");
    if (!watcomRuntimeLibraryValue) {
      watcomRuntimeLibraryValue = watcomRuntimeLibraryDefault;
    }
    std::string const watcomRuntimeLibrary = cmGeneratorExpression::Evaluate(
      *watcomRuntimeLibraryValue, this, config, target);
    if (!watcomRuntimeLibrary.empty()) {
      if (cmValue watcomRuntimeLibraryOptions = this->Makefile->GetDefinition(
            "CMAKE_" + lang + "_COMPILE_OPTIONS_WATCOM_RUNTIME_LIBRARY_" +
            watcomRuntimeLibrary)) {
        this->AppendCompileOptions(flags, *watcomRuntimeLibraryOptions);
      } else if ((this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_COMPILER_ID") == "OpenWatcom" ||
                  this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_SIMULATE_ID") == "OpenWatcom") &&
                 !cmSystemTools::GetErrorOccurredFlag()) {
        // The compiler uses the Watcom ABI so it needs a known runtime
        // library.
        this->IssueMessage(MessageType::FATAL_ERROR,
                           "WATCOM_RUNTIME_LIBRARY value '" +
                             watcomRuntimeLibrary + "' not known for this " +
                             lang + " compiler.");
      }
    }
  }

  // Add MSVC debug information format flags if CMP0141 is NEW.
  if (cm::optional<std::string> msvcDebugInformationFormat =
        this->GetMSVCDebugFormatName(config, target)) {
    if (!msvcDebugInformationFormat->empty()) {
      if (cmValue msvcDebugInformationFormatOptions =
            this->Makefile->GetDefinition(
              cmStrCat("CMAKE_", lang,
                       "_COMPILE_OPTIONS_MSVC_DEBUG_INFORMATION_FORMAT_",
                       *msvcDebugInformationFormat))) {
        this->AppendCompileOptions(flags, *msvcDebugInformationFormatOptions);
      } else if ((this->Makefile->GetSafeDefinition(
                    cmStrCat("CMAKE_", lang, "_COMPILER_ID")) == "MSVC"_s ||
                  this->Makefile->GetSafeDefinition(
                    cmStrCat("CMAKE_", lang, "_SIMULATE_ID")) == "MSVC"_s) &&
                 !cmSystemTools::GetErrorOccurredFlag()) {
        // The compiler uses the MSVC ABI so it needs a known runtime library.
        this->IssueMessage(MessageType::FATAL_ERROR,
                           cmStrCat("MSVC_DEBUG_INFORMATION_FORMAT value '",
                                    *msvcDebugInformationFormat,
                                    "' not known for this ", lang,
                                    " compiler."));
      }
    }
  }
}